

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::StreamExpressionWithRangeSyntax::setChild
          (StreamExpressionWithRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  ElementSelectSyntax *pEVar7;
  
  if (index == 0) {
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar6->field_0x2;
    NVar3.raw = (pvVar6->numFlags).raw;
    uVar4 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->withKeyword).kind = pvVar6->kind;
    (this->withKeyword).field_0x2 = uVar2;
    (this->withKeyword).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->withKeyword).rawLen = uVar4;
    (this->withKeyword).info = pIVar1;
  }
  else {
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pEVar7 = (ElementSelectSyntax *)0x0;
    }
    else {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pEVar7 = (ElementSelectSyntax *)*ppSVar5;
    }
    (this->range).ptr = pEVar7;
  }
  return;
}

Assistant:

void StreamExpressionWithRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: withKeyword = child.token(); return;
        case 1: range = child.node() ? &child.node()->as<ElementSelectSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}